

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O0

void __thiscall
diy::RegularDecomposer<diy::Bounds<double>_>::RegularDecomposer
          (RegularDecomposer<diy::Bounds<double>_> *this,int dim_,Bounds *domain_,int nblocks_,
          BoolVector *share_face_,BoolVector *wrap_,CoordinateVector *ghosts_,
          DivisionsVector *divisions_)

{
  size_type sVar1;
  int in_ECX;
  int in_ESI;
  int *in_RDI;
  vector<bool,_std::allocator<bool>_> *in_R8;
  size_type in_R9;
  undefined1 unaff_retaddr;
  size_type in_stack_00000008;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  vector<bool,_std::allocator<bool>_> *in_stack_00000028;
  vector<bool,_std::allocator<bool>_> *in_stack_00000030;
  vector<int,_std::allocator<int>_> *in_stack_00000318;
  RegularDecomposer<diy::Bounds<double>_> *in_stack_00000320;
  Bounds<double> *in_stack_ffffffffffffff78;
  Bounds<double> *in_stack_ffffffffffffff80;
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  
  *in_RDI = in_ESI;
  this_00 = in_stack_00000010;
  Bounds<double>::Bounds(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  in_RDI[0x2a] = in_ECX;
  __x = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c);
  std::vector<bool,_std::allocator<bool>_>::vector(in_stack_00000030,in_stack_00000028);
  std::vector<bool,_std::allocator<bool>_>::vector(in_stack_00000030,in_stack_00000028);
  std::vector<double,_std::allocator<double>_>::vector(in_stack_ffffffffffffffc0,__x);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc0,
             (vector<int,_std::allocator<int>_> *)__x);
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(in_R8);
  if ((int)sVar1 < *in_RDI) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  }
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(in_R8);
  if ((int)sVar1 < *in_RDI) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40));
  if ((int)sVar1 < *in_RDI) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)this_00,in_R9);
  }
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x46));
  if ((int)sVar1 < *in_RDI) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)this_00,in_R9);
  }
  fill_divisions(in_stack_00000320,in_stack_00000318);
  return;
}

Assistant:

RegularDecomposer(int               dim_,
                                      const Bounds&     domain_,
                                      int               nblocks_,
                                      BoolVector        share_face_ = BoolVector(),
                                      BoolVector        wrap_       = BoolVector(),
                                      CoordinateVector  ghosts_     = CoordinateVector(),
                                      DivisionsVector   divisions_  = DivisionsVector()):
                      dim(dim_), domain(domain_), nblocks(nblocks_),
                      share_face(share_face_),
                      wrap(wrap_), ghosts(ghosts_), divisions(divisions_)
    {
      if ((int) share_face.size() < dim)  share_face.resize(dim);
      if ((int) wrap.size() < dim)        wrap.resize(dim);
      if ((int) ghosts.size() < dim)      ghosts.resize(dim);
      if ((int) divisions.size() < dim)   divisions.resize(dim);

      fill_divisions(divisions);
    }